

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCallOverloaded
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,ArrayView<FunctionValue> functions
          ,IntrusiveList<TypeHandle> generics,SynCallArgument *argumentHead,bool allowFailure)

{
  IntrusiveList<TypeHandle> generics_00;
  ArrayView<ArgumentData> arguments_00;
  ExprBase *pEVar1;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ArgumentData> local_3a8;
  TypeHandle *local_398;
  TypeHandle *pTStack_390;
  FunctionValue *local_388;
  uint uStack_380;
  FunctionValue *local_378;
  uint uStack_370;
  undefined1 local_358 [8];
  SmallArray<ArgumentData,_16U> arguments;
  bool allowFailure_local;
  SynCallArgument *argumentHead_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<FunctionValue> functions_local;
  
  arguments.allocator._7_1_ = allowFailure;
  SmallArray<ArgumentData,_16U>::SmallArray
            ((SmallArray<ArgumentData,_16U> *)local_358,ctx->allocator);
  AnalyzeFunctionArgumentsEarly(ctx,argumentHead,(SmallArray<ArgumentData,_16U> *)local_358);
  functions_00._12_4_ = 0;
  functions_00.data = (FunctionValue *)SUB128(functions._0_12_,0);
  functions_00.count = SUB124(functions._0_12_,8);
  local_378 = functions.data;
  uStack_370 = functions.count;
  AnalyzeFunctionArgumentsFinal
            (ctx,source,value,functions_00,argumentHead,(SmallArray<ArgumentData,_16U> *)local_358);
  local_398 = generics.head;
  pTStack_390 = generics.tail;
  local_388 = functions.data;
  uStack_380 = functions.count;
  ArrayView<ArgumentData>::ArrayView<16u>(&local_3a8,(SmallArray<ArgumentData,_16U> *)local_358);
  functions_01.count = uStack_380;
  functions_01.data = local_388;
  generics_00.tail = pTStack_390;
  generics_00.head = local_398;
  arguments_00.count = local_3a8.count;
  arguments_00._12_4_ = local_3a8._12_4_;
  arguments_00.data = local_3a8.data;
  functions_01._12_4_ = 0;
  pEVar1 = CreateFunctionCallFinal
                     (ctx,source,value,functions_01,generics_00,arguments_00,
                      (bool)(arguments.allocator._7_1_ & 1));
  SmallArray<ArgumentData,_16U>::~SmallArray((SmallArray<ArgumentData,_16U> *)local_358);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCallOverloaded(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, SynCallArgument *argumentHead, bool allowFailure)
{
	SmallArray<ArgumentData, 16> arguments(ctx.allocator);
	
	AnalyzeFunctionArgumentsEarly(ctx, argumentHead, arguments);
	AnalyzeFunctionArgumentsFinal(ctx, source, value, functions, argumentHead, arguments);

	return CreateFunctionCallFinal(ctx, source, value, functions, generics, arguments, allowFailure);
}